

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall cmsys::CommandLineArguments::ProcessArgument(CommandLineArguments *this,char *arg)

{
  Internal *this_00;
  String local_30;
  
  this_00 = this->Internals;
  String::String(&local_30,arg);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CommandLineArguments::ProcessArgument(const char* arg)
{
  this->Internals->Argv.push_back(arg);
}